

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Run
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  void *pvVar2;
  Vector<float,_2> *v;
  long lVar3;
  Vec2 i0_v1_a0;
  Vector<unsigned_int,_2> local_108;
  Vector<unsigned_int,_2> local_100;
  Vector<unsigned_int,_2> local_f8;
  Vector<unsigned_int,_2> local_f0;
  UVec2 i1_v1_a2;
  UVec2 i1_v0_a2;
  UVec2 i0_v1_a2;
  Vector<int,_2> local_d0;
  Vector<int,_2> local_c8;
  Vector<int,_2> local_c0;
  Vector<int,_2> local_b8;
  IVec2 i1_v1_a1;
  IVec2 i1_v0_a1;
  IVec2 i0_v1_a1;
  Vector<float,_2> local_98;
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  Vec2 i1_v1_a0;
  Vec2 i1_v0_a0;
  Vec2 i0_v0_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char *glsl_vs;
  UVec2 i0_v0_a2;
  IVec2 i0_v0_a1;
  
  glsl_vs = 
  "#version 430 core\nlayout(location = 0) in vec2 vs_in_attrib0;\nlayout(location = 4) in ivec2 vs_in_attrib1;\nlayout(location = 8) in uvec2 vs_in_attrib2;\nlayout(location = 15) in float vs_in_attrib3;\nlayout(std430, binding = 1) buffer Output {\n  vec2 attrib0[4];\n  ivec2 attrib1[4];\n  uvec2 attrib2[4];\n  float attrib3[4];\n} g_output;\nvoid main() {\n  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;\n  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;\n  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;\n  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&glsl_vs);
  this->m_vsp = program;
  bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,program);
  if (!bVar1) {
    return -1;
  }
  glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,100000,(void *)0x0,0x88e4);
  pvVar2 = glu::CallLogWrapper::glMapBuffer(this_00,0x8892,0x88b9);
  *(undefined8 *)((long)pvVar2 + 0x10) = 0x400000003f800000;
  *(undefined8 *)((long)pvVar2 + 0x810) = 0x4080000040400000;
  *(undefined8 *)((long)pvVar2 + 0x80) = 0x600000005;
  *(undefined8 *)((long)pvVar2 + 0x880) = 0x800000007;
  *(undefined8 *)((long)pvVar2 + 0x400) = 0xa00000009;
  *(undefined8 *)((long)pvVar2 + 0xc00) = 0xc0000000b;
  *(undefined4 *)((long)pvVar2 + 0x7f0) = 0x41500000;
  *(undefined4 *)((long)pvVar2 + 0xff0) = 0x41600000;
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,8,2,0x1405,0x400);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0xf,1,0x1406,'\0',0x7f0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glVertexAttribIPointer(this_00,4,2,0x1404,0x800,(void *)0x80);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,8,3);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0xf,3);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x800);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,3,this->m_vbo,0,0x800);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,8);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xf);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  i0_v0_a0.m_data[0]._0_1_ = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,0x70,(value_type_conflict5 *)&i0_v0_a0,(allocator_type *)&i0_v1_a0);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_ssbo);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glEnable(this_00,0x8c89);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glDrawArraysInstanced(this_00,0,0,2,2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_ssbo);
  v = (Vector<float,_2> *)glu::CallLogWrapper::glMapBuffer(this_00,0x90d2,35000);
  tcu::Vector<float,_2>::Vector(&i0_v0_a0,v);
  tcu::Vector<float,_2>::Vector(&i0_v1_a0,v + 1);
  tcu::Vector<float,_2>::Vector(&i1_v0_a0,v + 2);
  tcu::Vector<float,_2>::Vector(&i1_v1_a0,v + 3);
  tcu::Vector<float,_2>::Vector(&local_80,&i0_v0_a0);
  if ((((local_80.m_data[0] == 1.0) && (!NAN(local_80.m_data[0]))) && (local_80.m_data[1] == 2.0))
     && (!NAN(local_80.m_data[1]))) {
    tcu::Vector<float,_2>::Vector(&local_88,&i0_v1_a0);
    if (((local_88.m_data[0] == 3.0) && (!NAN(local_88.m_data[0]))) &&
       ((local_88.m_data[1] == 4.0 && (!NAN(local_88.m_data[1]))))) {
      tcu::Vector<float,_2>::Vector(&local_90,&i1_v0_a0);
      if (((local_90.m_data[0] == 1.0) && (!NAN(local_90.m_data[0]))) &&
         ((local_90.m_data[1] == 2.0 && (!NAN(local_90.m_data[1]))))) {
        tcu::Vector<float,_2>::Vector(&local_98,&i1_v1_a0);
        if ((((local_98.m_data[0] == 3.0) && (!NAN(local_98.m_data[0]))) &&
            (local_98.m_data[1] == 4.0)) && (!NAN(local_98.m_data[1]))) {
          tcu::Vector<int,_2>::Vector(&i0_v0_a1,(Vector<int,_2> *)(v + 4));
          tcu::Vector<int,_2>::Vector(&i0_v1_a1,(Vector<int,_2> *)(v + 5));
          tcu::Vector<int,_2>::Vector(&i1_v0_a1,(Vector<int,_2> *)(v + 6));
          tcu::Vector<int,_2>::Vector(&i1_v1_a1,(Vector<int,_2> *)(v + 7));
          tcu::Vector<int,_2>::Vector(&local_b8,&i0_v0_a1);
          if (((((local_b8.m_data[0] == 5) && (local_b8.m_data[1] == 6)) &&
               ((tcu::Vector<int,_2>::Vector(&local_c0,&i0_v1_a1), local_c0.m_data[0] == 7 &&
                ((local_c0.m_data[1] == 8 &&
                 (tcu::Vector<int,_2>::Vector(&local_c8,&i1_v0_a1), local_c8.m_data[0] == 5)))))) &&
              (local_c8.m_data[1] == 6)) &&
             ((tcu::Vector<int,_2>::Vector(&local_d0,&i1_v1_a1), local_d0.m_data[0] == 7 &&
              (local_d0.m_data[1] == 8)))) {
            tcu::Vector<unsigned_int,_2>::Vector(&i0_v0_a2,(Vector<unsigned_int,_2> *)(v + 8));
            tcu::Vector<unsigned_int,_2>::Vector(&i0_v1_a2,(Vector<unsigned_int,_2> *)(v + 9));
            tcu::Vector<unsigned_int,_2>::Vector(&i1_v0_a2,(Vector<unsigned_int,_2> *)(v + 10));
            tcu::Vector<unsigned_int,_2>::Vector(&i1_v1_a2,(Vector<unsigned_int,_2> *)(v + 0xb));
            tcu::Vector<unsigned_int,_2>::Vector(&local_f0,&i0_v0_a2);
            if ((((local_f0.m_data[0] == 9) &&
                 (((local_f0.m_data[1] == 10 &&
                   (tcu::Vector<unsigned_int,_2>::Vector(&local_f8,&i0_v1_a2),
                   local_f8.m_data[0] == 0xb)) && (local_f8.m_data[1] == 0xc)))) &&
                (((((tcu::Vector<unsigned_int,_2>::Vector(&local_100,&i1_v0_a2),
                    local_100.m_data[0] == 9 && (local_100.m_data[1] == 10)) &&
                   (tcu::Vector<unsigned_int,_2>::Vector(&local_108,&i1_v1_a2),
                   local_108.m_data[0] == 0xb)) &&
                  ((local_108.m_data[1] == 0xc && (v[0xc].m_data[0] == 13.0)))) &&
                 (((!NAN(v[0xc].m_data[0]) &&
                   (((v[0xc].m_data[1] == 14.0 && (!NAN(v[0xc].m_data[1]))) &&
                    (v[0xd].m_data[0] == 13.0)))) &&
                  ((!NAN(v[0xd].m_data[0]) && (v[0xd].m_data[1] == 14.0)))))))) &&
               (!NAN(v[0xd].m_data[1]))) {
              glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
              lVar3 = 0;
              goto LAB_00a8ca24;
            }
          }
        }
      }
    }
  }
  lVar3 = -1;
LAB_00a8ca24:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in vec2 vs_in_attrib0;" NL
			"layout(location = 4) in ivec2 vs_in_attrib1;" NL "layout(location = 8) in uvec2 vs_in_attrib2;" NL
			"layout(location = 15) in float vs_in_attrib3;" NL "layout(std430, binding = 1) buffer Output {" NL
			"  vec2 attrib0[4];" NL "  ivec2 attrib1[4];" NL "  uvec2 attrib2[4];" NL "  float attrib3[4];" NL
			"} g_output;" NL "void main() {" NL
			"  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;" NL
			"  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;" NL
			"  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;" NL
			"  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;" NL "}";
		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		if (!CheckProgram(m_vsp))
			return ERROR;
		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);

		{
			glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
			glBufferData(GL_ARRAY_BUFFER, 100000, NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY));

			*reinterpret_cast<Vec2*>(&ptr[16 + 0 * 2048])	= Vec2(1.0f, 2.0f);
			*reinterpret_cast<Vec2*>(&ptr[16 + 1 * 2048])	= Vec2(3.0f, 4.0f);
			*reinterpret_cast<IVec2*>(&ptr[128 + 0 * 2048])  = IVec2(5, 6);
			*reinterpret_cast<IVec2*>(&ptr[128 + 1 * 2048])  = IVec2(7, 8);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 0 * 2048]) = UVec2(9, 10);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 1 * 2048]) = UVec2(11, 12);
			*reinterpret_cast<float*>(&ptr[2032 + 0 * 2048]) = 13.0f;
			*reinterpret_cast<float*>(&ptr[2032 + 1 * 2048]) = 14.0f;

			glUnmapBuffer(GL_ARRAY_BUFFER);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(8, 2, GL_UNSIGNED_INT, 1024);
		glVertexAttribFormat(15, 1, GL_FLOAT, GL_FALSE, 2032);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribIPointer(4, 2, GL_INT, 2048, reinterpret_cast<void*>(128));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glVertexAttribBinding(8, 3);
		glVertexAttribBinding(15, 3);
		glBindVertexBuffer(0, m_vbo, 0, 2048);
		glBindVertexBuffer(3, m_vbo, 0, 2048);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(4);
		glEnableVertexAttribArray(8);
		glEnableVertexAttribArray(15);
		glBindVertexArray(0);

		std::vector<GLubyte> data((sizeof(Vec2) + sizeof(IVec2) + sizeof(UVec2) + sizeof(float)) * 4, 0xff);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)data.size(), &data[0], GL_DYNAMIC_DRAW);

		glEnable(GL_RASTERIZER_DISCARD);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao);
		glDrawArraysInstanced(GL_POINTS, 0, 2, 2);

		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY));

			Vec2 i0_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[0]);
			Vec2 i0_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[8]);
			Vec2 i1_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[16]);
			Vec2 i1_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[24]);

			if (!IsEqual(i0_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i0_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;
			if (!IsEqual(i1_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i1_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;

			IVec2 i0_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[32]);
			IVec2 i0_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[40]);
			IVec2 i1_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[48]);
			IVec2 i1_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[56]);

			if (!IsEqual(i0_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i0_v1_a1, IVec2(7, 8)))
				return ERROR;
			if (!IsEqual(i1_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i1_v1_a1, IVec2(7, 8)))
				return ERROR;

			UVec2 i0_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[64]);
			UVec2 i0_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[72]);
			UVec2 i1_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[80]);
			UVec2 i1_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[88]);

			if (!IsEqual(i0_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i0_v1_a2, UVec2(11, 12)))
				return ERROR;
			if (!IsEqual(i1_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i1_v1_a2, UVec2(11, 12)))
				return ERROR;

			float i0_v0_a3 = *reinterpret_cast<float*>(&ptr[96]);
			float i0_v1_a3 = *reinterpret_cast<float*>(&ptr[100]);
			float i1_v0_a3 = *reinterpret_cast<float*>(&ptr[104]);
			float i1_v1_a3 = *reinterpret_cast<float*>(&ptr[108]);

			if (i0_v0_a3 != 13.0f)
				return ERROR;
			if (i0_v1_a3 != 14.0f)
				return ERROR;
			if (i1_v0_a3 != 13.0f)
				return ERROR;
			if (i1_v1_a3 != 14.0f)
				return ERROR;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		return NO_ERROR;
	}